

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

void separate_host(char *lfname,char *host)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  
  pcVar1 = lfname + 1;
  lVar4 = 2;
  for (lVar2 = 3; lfname[lVar2 + -2] != '}'; lVar2 = lVar2 + 1) {
    host[lVar2 + -3] = lfname[lVar2 + -2];
    lVar4 = lVar4 + 1;
  }
  host[lVar2 + -3] = '\0';
  if (lfname[lVar2] == '\0') {
    *lfname = '<';
  }
  else {
    pcVar3 = lfname + lVar2;
    if ((lfname[lVar2 + -1] != '/') && (lfname[lVar2 + -1] != '<')) {
      pcVar3 = lfname + lVar4;
      lVar2 = lVar4;
    }
    pcVar1 = pcVar3 + -lVar2;
    for (; *pcVar3 != '\0'; pcVar3 = pcVar3 + 1) {
      *pcVar1 = *pcVar3;
      pcVar1 = pcVar1 + 1;
    }
    if ((pcVar3[-1] == '>') && (pcVar3[-2] != '\'')) {
      pcVar1 = pcVar1 + -1;
    }
  }
  *pcVar1 = '\0';
  return;
}

Assistant:

void separate_host(char *lfname, char *host)
#endif /* DOS */
{
  char *cp;
  ptrdiff_t diff;

  cp = lfname + 1; /* Skip the initial "{". */

  while (*cp != '}') *host++ = *cp++;
  *host = '\0';

  cp++; /* Now, *cp == '<' or drive letter. */
#ifdef DOS
  /* Check if there's a drive specified. */

  if (*(cp + 1) == DRIVESEP) {
    *drive = *cp; /* copy the drive letter, if there is one */
    cp++;
    cp++; /* Move to the real `<`/ */
  } else
    *drive = '\0'; /* no drive */
#endif             /* DOS */

  if (*(cp + 1) == '\0') {
    /* Root directory is specified. */
    *lfname = '<';
    *(lfname + 1) = '\0';
  } else {
    diff = cp - lfname;
    if (*cp == '<' || *cp == DIRSEP
#ifdef DOS
        || *cp == UNIXDIRSEP
#endif /* DOS */
        ) {
      /*
       * Skip the initial directory delimiter.
       */
      cp++;
      diff++;
    }
    while (*cp) {
      *(cp - diff) = *cp;
      cp++;
    }
    if (*(cp - 1) == '>' && *(cp - 2) != '\'') {
      /*
       * The last character is a not quoted directory
       * delimiter.  We have to remove it from the result
       * lfname for the convenience of unixpathname.
       */
      *(cp - diff - 1) = '\0';
    } else {
      *(cp - diff) = '\0';
    }
  }
}